

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::DeadCodeEliminationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,DeadCodeEliminationCase *this,bool optimized)

{
  CaseShaderType CVar1;
  ProgramData *pPVar2;
  bool useConst;
  char *pcVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBX;
  bool optimized_00;
  _Alloc_hider _Var10;
  int iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string statements;
  size_type __dnew_2;
  string funcDefs;
  size_type __dnew_1;
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  long local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  string local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  undefined8 local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [3];
  ios_base local_180 [264];
  string local_78;
  ProgramData *local_58;
  string local_50;
  
  puVar6 = (undefined8 *)(CONCAT71(in_register_00000011,optimized) & 0xffffffff);
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_58 = __return_storage_ptr__;
  if (CVar1 == CASESHADERTYPE_FRAGMENT) {
    pcVar3 = local_290.field_2._M_local_buf + 7;
    local_290.field_2._M_local_buf[4] = 'u';
    local_290.field_2._M_allocated_capacity._5_2_ = 0x706d;
    local_290.field_2._M_allocated_capacity._0_4_ = 0x6964656d;
    local_290._M_string_length = 7;
  }
  else {
    if (CVar1 != CASESHADERTYPE_VERTEX) {
      std::__throw_logic_error("basic_string::_M_construct null not valid");
      goto switchD_010274b4_default;
    }
    pcVar3 = local_290.field_2._M_local_buf + 5;
    local_290.field_2._M_local_buf[4] = 'p';
    local_290.field_2._M_allocated_capacity._0_4_ = 0x68676968;
    local_290._M_string_length = 5;
  }
  *pcVar3 = '\0';
  optimized_00 = SUB81(puVar6,0);
  if (this->m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
    iVar11 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar11 = 0xc;
    }
    if (optimized_00 == false) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_290._M_dataplus._M_p,
                 local_290._M_dataplus._M_p + local_290._M_string_length);
      std::__cxx11::string::append((char *)&local_230);
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_290._M_dataplus._M_p)
      ;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      pcVar3 = (char *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3) {
        local_270.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
        local_270.field_2._8_8_ = puVar4[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
        local_270._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_270._M_string_length = puVar4[1];
      *puVar4 = pcVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2b0.field_2._M_allocated_capacity = *puVar8;
        local_2b0.field_2._8_8_ = puVar4[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *puVar8;
        local_2b0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_2b0._M_string_length = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_250.field_2._M_allocated_capacity = *puVar8;
        local_250.field_2._8_8_ = puVar4[3];
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar8;
        local_250._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_250._M_string_length = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_2d0 = &local_2c0;
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2c0._M_allocated_capacity = *puVar8;
        local_2c0._8_8_ = puVar4[3];
      }
      else {
        local_2c0._M_allocated_capacity = *puVar8;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_2c8 = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
      local_2f0 = &local_2e0;
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2e0._M_allocated_capacity = *puVar8;
        local_2e0._8_8_ = puVar4[3];
      }
      else {
        local_2e0._M_allocated_capacity = *puVar8;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_2e8 = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_320._M_allocated_capacity = *puVar8;
        local_320._8_8_ = puVar4[3];
        local_330 = &local_320;
      }
      else {
        local_320._M_allocated_capacity = *puVar8;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_328 = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_50._M_dataplus._M_p = (pointer)0x26;
      local_78._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_50);
      local_78.field_2._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
      builtin_strncpy(local_78._M_dataplus._M_p,"\tunused = sin(sin(sin(sin(unused))));\n",0x26);
      local_78._M_string_length = (size_type)local_50._M_dataplus._M_p;
      local_78._M_dataplus._M_p[(long)local_50._M_dataplus._M_p] = '\0';
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      repeat(&local_310,&local_78,iVar11,&local_50);
      uVar7 = (char *)0xf;
      if (local_330 != &local_320) {
        uVar7 = local_320._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (char *)(local_310._M_string_length + local_328)) {
        uVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          uVar7 = local_310.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < (char *)(local_310._M_string_length + local_328)) goto LAB_0102725a;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_330);
      }
      else {
LAB_0102725a:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_330,(ulong)local_310._M_dataplus._M_p);
      }
      local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1f0[0].field_2._0_8_ = *puVar8;
        local_1f0[0].field_2._8_8_ = puVar4[3];
      }
      else {
        local_1f0[0].field_2._0_8_ = *puVar8;
        local_1f0[0]._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_1f0[0]._M_string_length = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      puVar9 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_210.field_2._M_allocated_capacity = *puVar9;
        local_210.field_2._8_8_ = puVar4[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *puVar9;
        local_210._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_210._M_string_length = puVar4[1];
      *puVar4 = puVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
        operator_delete(local_1f0[0]._M_dataplus._M_p,
                        (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,
                        (ulong)(local_310.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        (ulong)(local_78.field_2._M_allocated_capacity + 1));
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
      }
      unaff_RBX = &local_230.field_2;
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        (ulong)(local_250.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,
                        (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        (ulong)(local_270.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p == unaff_RBX) goto LAB_01027495;
      uVar7 = (char *)CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]);
      _Var10._M_p = local_230._M_dataplus._M_p;
    }
    else {
      local_2d0 = &local_2c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_290._M_dataplus._M_p,
                 local_290._M_dataplus._M_p + local_290._M_string_length);
      std::__cxx11::string::append((char *)&local_2d0);
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
      local_2f0 = &local_2e0;
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2e0._M_allocated_capacity = *puVar8;
        local_2e0._8_8_ = puVar4[3];
      }
      else {
        local_2e0._M_allocated_capacity = *puVar8;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_2e8 = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_320._M_allocated_capacity = *puVar8;
        local_320._8_8_ = puVar4[3];
        local_330 = &local_320;
      }
      else {
        local_320._M_allocated_capacity = *puVar8;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar4;
      }
      local_328 = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_290._M_dataplus._M_p)
      ;
      unaff_RBX = &local_1f0[0].field_2;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar4;
      puVar8 = puVar4 + 2;
      if (local_1f0[0]._M_dataplus._M_p == (pointer)puVar8) {
        local_1f0[0].field_2._0_8_ = *puVar8;
        local_1f0[0].field_2._8_8_ = puVar4[3];
        local_1f0[0]._M_dataplus._M_p = (pointer)unaff_RBX;
      }
      else {
        local_1f0[0].field_2._0_8_ = *puVar8;
      }
      local_1f0[0]._M_string_length = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      puVar9 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_210.field_2._M_allocated_capacity = *puVar9;
        local_210.field_2._8_8_ = puVar4[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *puVar9;
        local_210._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_210._M_string_length = puVar4[1];
      *puVar4 = puVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p != unaff_RBX) {
        operator_delete(local_1f0[0]._M_dataplus._M_p,
                        (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
      }
      uVar7 = local_2c0._M_allocated_capacity;
      _Var10._M_p = (pointer)local_2d0;
      if (local_2d0 == &local_2c0) goto LAB_01027495;
    }
LAB_0102748d:
    operator_delete(_Var10._M_p,(ulong)(uVar7 + 1));
  }
  else if (this->m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
    if (optimized_00 == false) {
      unaff_RBX = &local_320;
      local_330 = unaff_RBX;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330,local_290._M_dataplus._M_p,
                 local_290._M_dataplus._M_p + local_290._M_string_length);
      std::__cxx11::string::append((char *)&local_330);
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_290._M_dataplus._M_p)
      ;
      puVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1f0[0].field_2._0_8_ = *puVar8;
        local_1f0[0].field_2._8_8_ = puVar4[3];
        local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
      }
      else {
        local_1f0[0].field_2._0_8_ = *puVar8;
        local_1f0[0]._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_1f0[0]._M_string_length = puVar4[1];
      *puVar4 = puVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      puVar9 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_210.field_2._M_allocated_capacity = *puVar9;
        local_210.field_2._8_8_ = plVar5[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *puVar9;
        local_210._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_210._M_string_length = plVar5[1];
      *plVar5 = (long)puVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
        operator_delete(local_1f0[0]._M_dataplus._M_p,
                        (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
      }
      uVar7 = local_320._M_allocated_capacity;
      _Var10._M_p = (pointer)local_330;
      if (local_330 != unaff_RBX) goto LAB_0102748d;
    }
    else {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_allocated_capacity =
           local_210.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
  }
  else {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,0x1af8059);
  }
LAB_01027495:
  switch(this->m_caseType) {
  case CASETYPE_DEAD_BRANCH_SIMPLE:
    if (optimized_00 == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      iVar11 = 4;
      if (CVar1 == CASESHADERTYPE_VERTEX) {
        iVar11 = 0x10;
      }
      std::ostream::operator<<(local_1f0,iVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base(local_180);
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x1be837c);
      local_330 = &local_320;
      puVar4 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar4) {
        local_320._M_allocated_capacity = *puVar4;
        local_320._8_8_ = puVar6[3];
      }
      else {
        local_320._M_allocated_capacity = *puVar4;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_328 = puVar6[1];
      *puVar6 = puVar4;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
LAB_01027ed8:
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      pcVar3 = (char *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3) {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
        local_310.field_2._8_8_ = puVar6[3];
      }
      else {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
        local_310._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_310._M_string_length = puVar6[1];
      *puVar6 = pcVar3;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      if (local_330 != &local_320) {
        operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
      }
      uVar7 = local_2e0._M_allocated_capacity;
      _Var10._M_p = (pointer)local_2f0;
      if (local_2f0 == &local_2e0) goto LAB_01028856;
      goto LAB_0102884e;
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    local_1f0[0]._M_dataplus._M_p = (pointer)0x2b;
    local_310._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_1f0);
    break;
  case CASETYPE_DEAD_BRANCH_COMPLEX:
    useConst = true;
    goto LAB_01027608;
  case CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST:
    useConst = false;
LAB_01027608:
    deadBranchComplexCaseStatements
              (&local_310,optimized_00,&local_290,useConst,CVar1 == CASESHADERTYPE_VERTEX);
    goto LAB_01028856;
  case CASETYPE_DEAD_BRANCH_FUNC_CALL:
    if (optimized_00 == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      iVar11 = 4;
      if (CVar1 == CASESHADERTYPE_VERTEX) {
        iVar11 = 0x10;
      }
      std::ostream::operator<<(local_1f0,iVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base(local_180);
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x1be84e4);
      local_330 = &local_320;
      puVar4 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar4) {
        local_320._M_allocated_capacity = *puVar4;
        local_320._8_8_ = puVar6[3];
      }
      else {
        local_320._M_allocated_capacity = *puVar4;
        local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_328 = puVar6[1];
      *puVar6 = puVar4;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      goto LAB_01027ed8;
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    local_1f0[0]._M_dataplus._M_p = (pointer)0x2b;
    local_310._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_1f0);
    break;
  case CASETYPE_UNUSED_VALUE_BASIC:
    iVar11 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar11 = 0xc;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_290);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
LAB_01027718:
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      pcVar3 = (char *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3) {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
        local_310.field_2._8_8_ = puVar6[3];
      }
      else {
        local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
        local_310._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_310._M_string_length = puVar6[1];
      *puVar6 = pcVar3;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      uVar7 = local_1f0[0].field_2._M_allocated_capacity;
      _Var10._M_p = local_1f0[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0[0]._M_dataplus._M_p == &local_1f0[0].field_2) goto LAB_01028856;
      goto LAB_0102884e;
    }
    std::operator+(&local_250,"\t",&local_290);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_2d0 = &local_2c0;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2c0._8_8_ = puVar6[3];
    }
    else {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2c8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p);
    local_2f0 = &local_2e0;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2e0._8_8_ = puVar6[3];
    }
    else {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_320._M_allocated_capacity = *puVar4;
      local_320._8_8_ = puVar6[3];
      local_330 = &local_320;
    }
    else {
      local_320._M_allocated_capacity = *puVar4;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_328 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_230._M_dataplus._M_p = (char *)0x26;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_230);
    local_270.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x11) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x12) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x13) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x15) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x16) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x17) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x18) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x19) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1a) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1b) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1c) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1d) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1f) = 'd';
    *(undefined8 *)local_270._M_dataplus._M_p = 0x20646573756e7509;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 8) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 9) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1f) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x20) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x21) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x22) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x23) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x24) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x25) = '\n';
    local_270._M_string_length = (size_type)local_230._M_dataplus._M_p;
    local_270._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    repeat(&local_2b0,&local_270,iVar11,&local_230);
    uVar7 = (char *)0xf;
    if (local_330 != &local_320) {
      uVar7 = local_320._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (char *)(local_2b0._M_string_length + local_328)) {
      uVar7 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar7 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (char *)(local_2b0._M_string_length + local_328)) goto LAB_01027e6b;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_01027e6b:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_1f0[0].field_2._0_8_ = *puVar4;
      local_1f0[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1f0[0].field_2._0_8_ = *puVar4;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1f0[0]._M_string_length = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)puVar4 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar3 = (char *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310.field_2._8_8_ = puVar6[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_310._M_string_length = puVar6[1];
    *puVar6 = pcVar3;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,
                      (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) {
LAB_010283c0:
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    goto LAB_010283cd;
  case CASETYPE_UNUSED_VALUE_LOOP:
    iVar11 = 4;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar11 = 0x10;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_290);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      goto LAB_01027718;
    }
    std::operator+(&local_2b0,"\t",&local_290);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_250.field_2._M_allocated_capacity = *puVar4;
      local_250.field_2._8_8_ = puVar6[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *puVar4;
      local_250._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_250._M_string_length = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_290._M_dataplus._M_p);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2c0._8_8_ = puVar6[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2c8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2e0._8_8_ = puVar6[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::ostream::operator<<(local_1f0,iVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
    uVar7 = (char *)0xf;
    if (local_2f0 != &local_2e0) {
      uVar7 = local_2e0._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (char *)(local_270._M_string_length + local_2e8)) {
      uVar7 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar7 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (char *)(local_270._M_string_length + local_2e8)) goto LAB_01028016;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
    }
    else {
LAB_01028016:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p)
      ;
    }
    local_330 = &local_320;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_320._M_allocated_capacity = *puVar4;
      local_320._8_8_ = puVar6[3];
    }
    else {
      local_320._M_allocated_capacity = *puVar4;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_328 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)puVar4 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar3 = (char *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310.field_2._8_8_ = puVar6[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_310._M_string_length = puVar6[1];
    *puVar6 = pcVar3;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      (ulong)(local_250.field_2._M_allocated_capacity + 1));
    }
    uVar7 = local_2b0.field_2._M_allocated_capacity;
    _Var10._M_p = local_2b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) goto LAB_01028856;
    goto LAB_0102884e;
  case CASETYPE_UNUSED_VALUE_DEAD_BRANCH:
    iVar11 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar11 = 0xc;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_290);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      goto LAB_01027718;
    }
    std::operator+(&local_250,"\t",&local_290);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_2d0 = &local_2c0;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2c0._8_8_ = puVar6[3];
    }
    else {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2c8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2e0._8_8_ = puVar6[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_320._M_allocated_capacity = *puVar4;
      local_320._8_8_ = puVar6[3];
      local_330 = &local_320;
    }
    else {
      local_320._M_allocated_capacity = *puVar4;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_328 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_230._M_dataplus._M_p = (char *)0x26;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_230);
    local_270.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x11) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x12) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x13) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x15) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x16) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x17) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x18) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x19) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1a) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1b) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1c) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1d) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1f) = 'd';
    *(undefined8 *)local_270._M_dataplus._M_p = 0x20646573756e7509;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 8) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 9) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1f) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x20) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x21) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x22) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x23) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x24) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x25) = '\n';
    local_270._M_string_length = (size_type)local_230._M_dataplus._M_p;
    local_270._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    repeat(&local_2b0,&local_270,iVar11,&local_230);
    uVar7 = (char *)0xf;
    if (local_330 != &local_320) {
      uVar7 = local_320._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (char *)(local_2b0._M_string_length + local_328)) {
      uVar7 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar7 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (char *)(local_2b0._M_string_length + local_328)) goto LAB_01028130;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_01028130:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_1f0[0].field_2._0_8_ = *puVar4;
      local_1f0[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1f0[0].field_2._0_8_ = *puVar4;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1f0[0]._M_string_length = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)puVar4 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar3 = (char *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310.field_2._8_8_ = puVar6[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_310._M_string_length = puVar6[1];
    *puVar6 = pcVar3;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,
                      (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    if (local_2d0 != &local_2c0) goto LAB_010283d7;
    goto LAB_010283e4;
  case CASETYPE_UNUSED_VALUE_AFTER_RETURN:
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    local_1f0[0]._M_dataplus._M_p = &DAT_00000016;
    local_310._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)local_1f0);
    *(undefined8 *)local_310._M_dataplus._M_p = 0x3d2065756c617609;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 8) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 9) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 10) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xb) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xc) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xe) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xe) = 'v';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0xf) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x10) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x11) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x12) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x13) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x14) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p + 0x15) = '\n';
    goto LAB_010275fd;
  case CASETYPE_UNUSED_VALUE_MUL_ZERO:
    iVar11 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar11 = 0xc;
    }
    if (optimized_00 != false) {
      std::operator+(local_1f0,"\t",&local_290);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
      goto LAB_01027718;
    }
    std::operator+(&local_250,"\t",&local_290);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_2d0 = &local_2c0;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2c0._8_8_ = puVar6[3];
    }
    else {
      local_2c0._M_allocated_capacity = *puVar4;
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2c8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2e0._8_8_ = puVar6[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = *puVar4;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2e8 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_320._M_allocated_capacity = *puVar4;
      local_320._8_8_ = puVar6[3];
      local_330 = &local_320;
    }
    else {
      local_320._M_allocated_capacity = *puVar4;
      local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_328 = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_230._M_dataplus._M_p = (char *)0x26;
    local_270._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_230);
    local_270.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x11) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x12) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x13) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x15) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x16) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x17) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x18) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x19) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1a) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1b) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1c) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1d) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1f) = 'd';
    *(undefined8 *)local_270._M_dataplus._M_p = 0x20646573756e7509;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 8) = '=';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 9) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xc) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xd) = '(';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xe) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x1f) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x20) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x21) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x22) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x23) = ')';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x24) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p + 0x25) = '\n';
    local_270._M_string_length = (size_type)local_230._M_dataplus._M_p;
    local_270._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    repeat(&local_2b0,&local_270,iVar11,&local_230);
    uVar7 = (char *)0xf;
    if (local_330 != &local_320) {
      uVar7 = local_320._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (char *)(local_2b0._M_string_length + local_328)) {
      uVar7 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar7 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (char *)(local_2b0._M_string_length + local_328)) goto LAB_0102824a;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_0102824a:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_1f0[0]._M_dataplus._M_p = (pointer)&local_1f0[0].field_2;
    puVar4 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4) {
      local_1f0[0].field_2._0_8_ = *puVar4;
      local_1f0[0].field_2._8_8_ = puVar6[3];
    }
    else {
      local_1f0[0].field_2._0_8_ = *puVar4;
      local_1f0[0]._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1f0[0]._M_string_length = puVar6[1];
    *puVar6 = puVar4;
    puVar6[1] = 0;
    *(undefined1 *)puVar4 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_1f0);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    pcVar3 = (char *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3) {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310.field_2._8_8_ = puVar6[3];
    }
    else {
      local_310.field_2._M_allocated_capacity = *(undefined8 *)pcVar3;
      local_310._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_310._M_string_length = puVar6[1];
    *puVar6 = pcVar3;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0]._M_dataplus._M_p != &local_1f0[0].field_2) {
      operator_delete(local_1f0[0]._M_dataplus._M_p,
                      (ulong)(local_1f0[0].field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if (local_2f0 != &local_2e0) goto LAB_010283c0;
LAB_010283cd:
    if (local_2d0 != &local_2c0) {
LAB_010283d7:
      operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
    }
LAB_010283e4:
    uVar7 = local_250.field_2._M_allocated_capacity;
    _Var10._M_p = local_250._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
LAB_0102884e:
      operator_delete(_Var10._M_p,(ulong)(uVar7 + 1));
    }
    goto LAB_01028856;
  default:
switchD_010274b4_default:
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    uVar7 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if (local_330 != &local_320) {
      operator_delete(local_330,(ulong)(local_320._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if (local_2f0 != unaff_RBX) {
      operator_delete(local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
    }
    if (local_2d0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      operator_delete(local_2d0,(ulong)(local_2c0._M_allocated_capacity + 1));
    }
    if (local_250._M_dataplus._M_p != (pointer)(ulong)CVar1) {
      operator_delete(local_250._M_dataplus._M_p,
                      (ulong)(local_250.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      (ulong)(local_2b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT17(local_290.field_2._M_local_buf[7],
                               CONCAT25(local_290.field_2._M_allocated_capacity._5_2_,
                                        CONCAT14(local_290.field_2._M_local_buf[4],
                                                 local_290.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar7);
  }
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1b) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1c) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1d) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1e) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1f) = '9';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x20) = ')';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x21) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x22) = '*';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x23) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x24) = 'v';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x25) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x26) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x27) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x28) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x29) = ';';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x2a) = '\n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x10) = '6';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x11) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x12) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x13) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x14) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x15) = '7';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x16) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x17) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x18) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x19) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1a) = '8';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1b) = ',';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1c) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1d) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1e) = '.';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x1f) = '9';
  *(undefined8 *)local_310._M_dataplus._M_p = 0x3d2065756c617609;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 8) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 9) = 'v';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 10) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xb) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xc) = '4';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xd) = '(';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xe) = '0';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xf) = '.';
LAB_010275fd:
  local_310._M_dataplus._M_p[(long)local_1f0[0]._M_dataplus._M_p] = '\0';
  local_310._M_string_length = (size_type)local_1f0[0]._M_dataplus._M_p;
  local_310.field_2._M_allocated_capacity = (size_type)local_1f0[0]._M_dataplus._M_p;
LAB_01028856:
  pPVar2 = local_58;
  defaultProgramData(local_58,(this->super_ShaderOptimizationCase).m_caseShaderType,&local_210,
                     &local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,(ulong)(local_310.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT17(local_290.field_2._M_local_buf[7],
                             CONCAT25(local_290.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_290.field_2._M_local_buf[4],
                                               local_290.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return pPVar2;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	funcDefs		= m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL		? deadBranchFuncCallCaseFuncDefs		(optimized, precision)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN	? unusedValueAfterReturnCaseFuncDefs	(optimized, precision, isVertexCase)
										: "";

		const string	statements		= m_caseType == CASETYPE_DEAD_BRANCH_SIMPLE				? deadBranchSimpleCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX			? deadBranchComplexCaseStatements			(optimized, precision, true,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? deadBranchComplexCaseStatements			(optimized, precision, false,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL			? deadBranchFuncCallCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_BASIC				? unusedValueBasicCaseStatements			(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_LOOP				? unusedValueLoopCaseStatements				(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? unusedValueDeadBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN		? unusedValueAfterReturnCaseStatements		()
										: m_caseType == CASETYPE_UNUSED_VALUE_MUL_ZERO			? unusedValueMulZeroCaseStatements			(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, funcDefs, statements);
	}